

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::gga_screening_interface<ExchCXX::BuiltinB88>::eval_exc_unpolar
               (double rho,double sigma,double *eps)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double sigma_tol_sq;
  double *in_stack_00000110;
  double in_stack_00000118;
  double in_stack_00000120;
  double in_stack_ffffffffffffffd8;
  
  if (1e-25 < in_XMM0_Qa) {
    safe_max<double>(2.1544346900319022e-67,in_stack_ffffffffffffffd8);
    kernel_traits<ExchCXX::BuiltinB88>::eval_exc_unpolar_impl
              (in_stack_00000120,in_stack_00000118,in_stack_00000110);
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar( double rho, double sigma, double& eps ) {

    if( rho <= traits::dens_tol ) {
      eps = 0.;
    } else {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      sigma = safe_max(sigma, sigma_tol_sq); 
      traits::eval_exc_unpolar_impl( rho, sigma, eps );
    }

  }